

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O3

void __thiscall xe::xml::Writer::Writer(Writer *this,ostream *dst)

{
  this->m_rawDst = dst;
  *(code **)&this->m_dataBuf = std::_Rb_tree_increment;
  *(undefined8 *)&(this->m_dataBuf).field_0x8 = 0;
  *(undefined8 *)&(this->m_dataBuf).field_0x10 = 0;
  *(undefined8 *)&(this->m_dataBuf).field_0x18 = 0;
  *(undefined8 *)&(this->m_dataBuf).field_0x20 = 0;
  *(undefined8 *)&(this->m_dataBuf).field_0x28 = 0;
  *(undefined8 *)&(this->m_dataBuf).field_0x30 = 0;
  std::locale::locale((locale *)&(this->m_dataBuf).field_0x38);
  *(undefined ***)&this->m_dataBuf = &PTR__streambuf_0011cac0;
  (this->m_dataBuf).m_dst = dst;
  std::ostream::ostream(&this->m_dataStr,&(this->m_dataBuf).super_streambuf);
  this->m_state = STATE_DATA;
  (this->m_elementStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_elementStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_elementStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Writer::Writer (std::ostream& dst)
	: m_rawDst	(dst)
	, m_dataBuf	(dst)
	, m_dataStr	(&m_dataBuf)
	, m_state	(STATE_DATA)
{
}